

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O0

void google::protobuf::compiler::php::GenerateMessageToPool
               (string *name_prefix,Descriptor *message,Printer *printer)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  MessageOptions *this;
  ulong uVar6;
  string *psVar7;
  Descriptor *pDVar8;
  FieldDescriptor *pFVar9;
  OneofDescriptor *pOVar10;
  char *pcVar11;
  EnumDescriptor *en;
  undefined1 in_CL;
  undefined1 uVar12;
  int i_00;
  int i_01;
  int i_02;
  FieldDescriptor *field_00;
  int local_330;
  int local_32c;
  int i_3;
  int i_2;
  string local_308;
  allocator<char> local_2e1;
  string local_2e0;
  string local_2c0;
  FieldDescriptor *local_2a0;
  FieldDescriptor *field_1;
  OneofDescriptor *pOStack_290;
  int index;
  OneofDescriptor *oneof;
  undefined1 local_280 [4];
  int i_1;
  string local_260;
  allocator<char> local_239;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  allocator<char> local_191;
  string local_190;
  string local_170;
  allocator<char> local_149;
  string local_148;
  string local_128;
  allocator<char> local_101;
  string local_100;
  FieldDescriptor *local_e0;
  FieldDescriptor *val;
  string local_d0;
  FieldDescriptor *local_b0;
  FieldDescriptor *key;
  FieldDescriptor *field;
  undefined1 local_98 [4];
  int i;
  byte local_61;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_40 [8];
  string class_name;
  Printer *printer_local;
  Descriptor *message_local;
  string *name_prefix_local;
  
  class_name.field_2._8_8_ = printer;
  this = Descriptor::options(message);
  bVar2 = MessageOptions::map_entry(this);
  if (!bVar2) {
    uVar6 = std::__cxx11::string::empty();
    local_61 = 0;
    if ((uVar6 & 1) == 0) {
      std::operator+(&local_60,name_prefix,"_");
      local_61 = 1;
      psVar7 = Descriptor::name_abi_cxx11_(message);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                     &local_60,psVar7);
    }
    else {
      psVar7 = Descriptor::name_abi_cxx11_(message);
      std::__cxx11::string::string((string *)local_40,(string *)psVar7);
    }
    if ((local_61 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_60);
    }
    uVar1 = class_name.field_2._8_8_;
    MessageFullName_abi_cxx11_((string *)local_98,(php *)message,(Descriptor *)0x1,(bool)in_CL);
    io::Printer::Print((Printer *)uVar1,
                       "$pool->addMessage(\'^message^\', \\Google\\Protobuf\\Internal\\^class_name^::class)\n"
                       ,"message",(string *)local_98,"class_name",(string *)local_40);
    std::__cxx11::string::~string((string *)local_98);
    Indent((Printer *)class_name.field_2._8_8_);
    field._4_4_ = 0;
    while( true ) {
      iVar5 = field._4_4_;
      iVar3 = Descriptor::field_count(message);
      uVar12 = (undefined1)iVar3;
      if (iVar3 <= iVar5) break;
      key = Descriptor::field(message,field._4_4_);
      bVar2 = FieldDescriptor::is_map(key);
      if (bVar2) {
        pDVar8 = FieldDescriptor::message_type(key);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d0,"key",(allocator<char> *)((long)&val + 7));
        pFVar9 = Descriptor::FindFieldByName(pDVar8,&local_d0);
        std::__cxx11::string::~string((string *)&local_d0);
        std::allocator<char>::~allocator((allocator<char> *)((long)&val + 7));
        local_b0 = pFVar9;
        pDVar8 = FieldDescriptor::message_type(key);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_100,"value",&local_101);
        pFVar9 = Descriptor::FindFieldByName(pDVar8,&local_100);
        std::__cxx11::string::~string((string *)&local_100);
        std::allocator<char>::~allocator(&local_101);
        uVar1 = class_name.field_2._8_8_;
        local_e0 = pFVar9;
        psVar7 = FieldDescriptor::name_abi_cxx11_(key);
        pcVar11 = FieldDescriptor::type_name(local_b0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_148,pcVar11,&local_149);
        ToUpper(&local_128,&local_148);
        pcVar11 = FieldDescriptor::type_name(local_e0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_190,pcVar11,&local_191);
        ToUpper(&local_170,&local_190);
        uVar4 = FieldDescriptor::number(key);
        SimpleItoa_abi_cxx11_(&local_1b8,(protobuf *)(ulong)uVar4,i_00);
        EnumOrMessageSuffix_abi_cxx11_
                  (&local_1d8,(php *)local_e0,(FieldDescriptor *)0x1,(bool)uVar12);
        io::Printer::Print((Printer *)uVar1,
                           "->map(\'^field^\', \\Google\\Protobuf\\Internal\\GPBType::^key^, \\Google\\Protobuf\\Internal\\GPBType::^value^, ^number^^other^)\n"
                           ,"field",psVar7,"key",&local_128,"value",&local_170,"number",&local_1b8,
                           "other",&local_1d8);
        std::__cxx11::string::~string((string *)&local_1d8);
        std::__cxx11::string::~string((string *)&local_1b8);
        std::__cxx11::string::~string((string *)&local_170);
        std::__cxx11::string::~string((string *)&local_190);
        std::allocator<char>::~allocator(&local_191);
        std::__cxx11::string::~string((string *)&local_128);
        std::__cxx11::string::~string((string *)&local_148);
        std::allocator<char>::~allocator(&local_149);
      }
      else {
        pOVar10 = FieldDescriptor::containing_oneof(key);
        uVar1 = class_name.field_2._8_8_;
        if (pOVar10 == (OneofDescriptor *)0x0) {
          psVar7 = FieldDescriptor::name_abi_cxx11_(key);
          LabelForField_abi_cxx11_(&local_1f8,(php *)key,field_00);
          pcVar11 = FieldDescriptor::type_name(key);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_238,pcVar11,&local_239);
          ToUpper(&local_218,&local_238);
          uVar4 = FieldDescriptor::number(key);
          SimpleItoa_abi_cxx11_(&local_260,(protobuf *)(ulong)uVar4,i_01);
          EnumOrMessageSuffix_abi_cxx11_
                    ((string *)local_280,(php *)key,(FieldDescriptor *)0x1,(bool)uVar12);
          io::Printer::Print((Printer *)uVar1,
                             "->^label^(\'^field^\', \\Google\\Protobuf\\Internal\\GPBType::^type^, ^number^^other^)\n"
                             ,"field",psVar7,"label",&local_1f8,"type",&local_218,"number",
                             &local_260,"other",(string *)local_280);
          std::__cxx11::string::~string((string *)local_280);
          std::__cxx11::string::~string((string *)&local_260);
          std::__cxx11::string::~string((string *)&local_218);
          std::__cxx11::string::~string((string *)&local_238);
          std::allocator<char>::~allocator(&local_239);
          std::__cxx11::string::~string((string *)&local_1f8);
        }
      }
      field._4_4_ = field._4_4_ + 1;
    }
    for (oneof._4_4_ = 0; iVar5 = oneof._4_4_, iVar3 = Descriptor::oneof_decl_count(message),
        iVar5 < iVar3; oneof._4_4_ = oneof._4_4_ + 1) {
      pOStack_290 = Descriptor::oneof_decl(message,oneof._4_4_);
      uVar1 = class_name.field_2._8_8_;
      psVar7 = OneofDescriptor::name_abi_cxx11_(pOStack_290);
      io::Printer::Print((Printer *)uVar1,"->oneof(^name^)\n","name",psVar7);
      Indent((Printer *)class_name.field_2._8_8_);
      field_1._4_4_ = 0;
      while( true ) {
        iVar5 = field_1._4_4_;
        iVar3 = OneofDescriptor::field_count(pOStack_290);
        uVar12 = (undefined1)iVar3;
        if (iVar3 <= iVar5) break;
        local_2a0 = OneofDescriptor::field(pOStack_290,field_1._4_4_);
        uVar1 = class_name.field_2._8_8_;
        psVar7 = FieldDescriptor::name_abi_cxx11_(local_2a0);
        pcVar11 = FieldDescriptor::type_name(local_2a0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e0,pcVar11,&local_2e1);
        ToUpper(&local_2c0,&local_2e0);
        uVar4 = FieldDescriptor::number(local_2a0);
        SimpleItoa_abi_cxx11_(&local_308,(protobuf *)(ulong)uVar4,i_02);
        EnumOrMessageSuffix_abi_cxx11_
                  ((string *)&i_3,(php *)local_2a0,(FieldDescriptor *)0x1,(bool)uVar12);
        io::Printer::Print((Printer *)uVar1,
                           "->value(\'^field^\', \\Google\\Protobuf\\Internal\\GPBType::^type^, ^number^^other^)\n"
                           ,"field",psVar7,"type",&local_2c0,"number",&local_308,"other",
                           (string *)&i_3);
        std::__cxx11::string::~string((string *)&i_3);
        std::__cxx11::string::~string((string *)&local_308);
        std::__cxx11::string::~string((string *)&local_2c0);
        std::__cxx11::string::~string((string *)&local_2e0);
        std::allocator<char>::~allocator(&local_2e1);
        field_1._4_4_ = field_1._4_4_ + 1;
      }
      io::Printer::Print((Printer *)class_name.field_2._8_8_,"->finish()\n");
      Outdent((Printer *)class_name.field_2._8_8_);
    }
    io::Printer::Print((Printer *)class_name.field_2._8_8_,"->finalizeToPool();\n");
    Outdent((Printer *)class_name.field_2._8_8_);
    io::Printer::Print((Printer *)class_name.field_2._8_8_,"\n");
    for (local_32c = 0; iVar5 = Descriptor::nested_type_count(message), local_32c < iVar5;
        local_32c = local_32c + 1) {
      pDVar8 = Descriptor::nested_type(message,local_32c);
      GenerateMessageToPool((string *)local_40,pDVar8,(Printer *)class_name.field_2._8_8_);
    }
    for (local_330 = 0; iVar5 = Descriptor::enum_type_count(message), local_330 < iVar5;
        local_330 = local_330 + 1) {
      en = Descriptor::enum_type(message,local_330);
      GenerateEnumToPool(en,(Printer *)class_name.field_2._8_8_);
    }
    std::__cxx11::string::~string((string *)local_40);
  }
  return;
}

Assistant:

void GenerateMessageToPool(const string& name_prefix, const Descriptor* message,
                           io::Printer* printer) {
  // Don't generate MapEntry messages -- we use the PHP extension's native
  // support for map fields instead.
  if (message->options().map_entry()) {
    return;
  }
  string class_name = name_prefix.empty()?
      message->name() : name_prefix + "_" + message->name();

  printer->Print(
      "$pool->addMessage('^message^', "
      "\\Google\\Protobuf\\Internal\\^class_name^::class)\n",
      "message", MessageFullName(message, true),
      "class_name", class_name);

  Indent(printer);

  for (int i = 0; i < message->field_count(); i++) {
    const FieldDescriptor* field = message->field(i);
    if (field->is_map()) {
      const FieldDescriptor* key =
          field->message_type()->FindFieldByName("key");
      const FieldDescriptor* val =
          field->message_type()->FindFieldByName("value");
      printer->Print(
          "->map('^field^', \\Google\\Protobuf\\Internal\\GPBType::^key^, "
          "\\Google\\Protobuf\\Internal\\GPBType::^value^, ^number^^other^)\n",
          "field", field->name(),
          "key", ToUpper(key->type_name()),
          "value", ToUpper(val->type_name()),
          "number", SimpleItoa(field->number()),
          "other", EnumOrMessageSuffix(val, true));
    } else if (!field->containing_oneof()) {
      printer->Print(
          "->^label^('^field^', "
          "\\Google\\Protobuf\\Internal\\GPBType::^type^, ^number^^other^)\n",
          "field", field->name(),
          "label", LabelForField(field),
          "type", ToUpper(field->type_name()),
          "number", SimpleItoa(field->number()),
          "other", EnumOrMessageSuffix(field, true));
    }
  }

  // oneofs.
  for (int i = 0; i < message->oneof_decl_count(); i++) {
    const OneofDescriptor* oneof = message->oneof_decl(i);
    printer->Print("->oneof(^name^)\n",
                   "name", oneof->name());
    Indent(printer);
    for (int index = 0; index < oneof->field_count(); index++) {
      const FieldDescriptor* field = oneof->field(index);
      printer->Print(
          "->value('^field^', "
          "\\Google\\Protobuf\\Internal\\GPBType::^type^, ^number^^other^)\n",
          "field", field->name(),
          "type", ToUpper(field->type_name()),
          "number", SimpleItoa(field->number()),
          "other", EnumOrMessageSuffix(field, true));
    }
    printer->Print("->finish()\n");
    Outdent(printer);
  }

  printer->Print(
      "->finalizeToPool();\n");

  Outdent(printer);

  printer->Print(
      "\n");

  for (int i = 0; i < message->nested_type_count(); i++) {
    GenerateMessageToPool(class_name, message->nested_type(i), printer);
  }
  for (int i = 0; i < message->enum_type_count(); i++) {
    GenerateEnumToPool(message->enum_type(i), printer);
  }
}